

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

size_t __thiscall edition_unittest::TestAllTypes::ByteSizeLong(TestAllTypes *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  ulong uVar17;
  long lVar18;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar19;
  Rep *pRVar20;
  long lVar21;
  int n;
  int n_1;
  long lVar22;
  long lVar23;
  RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup> *pRVar24;
  RepeatedPtrField<edition_unittest::ForeignMessage> *pRVar25;
  RepeatedPtrField<proto2_unittest_import::ImportMessage> *pRVar26;
  RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *pRVar27;
  RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup> *this_00;
  RepeatedPtrField<edition_unittest::ForeignMessage> *this_01;
  RepeatedPtrField<proto2_unittest_import::ImportMessage> *this_02;
  RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *pRVar28;
  long local_98;
  long local_90;
  long local_88;
  
  sVar11 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_int32_,2,
                      &(this->field_0)._impl_._repeated_int32_cached_byte_size_);
  sVar12 = google::protobuf::internal::WireFormatLite::Int64SizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_int64_,2,
                      &(this->field_0)._impl_._repeated_int64_cached_byte_size_);
  sVar13 = google::protobuf::internal::WireFormatLite::UInt32SizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_uint32_,2,
                      &(this->field_0)._impl_._repeated_uint32_cached_byte_size_);
  sVar14 = google::protobuf::internal::WireFormatLite::UInt64SizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_uint64_,2,
                      &(this->field_0)._impl_._repeated_uint64_cached_byte_size_);
  sVar15 = google::protobuf::internal::WireFormatLite::SInt32SizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_sint32_,2,
                      &(this->field_0)._impl_._repeated_sint32_cached_byte_size_);
  sVar16 = google::protobuf::internal::WireFormatLite::SInt64SizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_sint64_,2,
                      &(this->field_0)._impl_._repeated_sint64_cached_byte_size_);
  uVar4 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_fixed32_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 0xa0) & 4) == 0);
  if (uVar4 == 0) {
    local_88 = 0;
  }
  else {
    uVar17 = ((long)((ulong)uVar4 << 0x22) >> 0x20) + 1;
    lVar21 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    local_88 = (ulong)((int)lVar21 * 9 + 0x49U >> 6) + 2;
  }
  uVar5 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_fixed64_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 0xb0) & 4) == 0);
  if (uVar5 == 0) {
    lVar21 = 0;
  }
  else {
    uVar17 = ((long)((ulong)uVar5 << 0x23) >> 0x20) + 1;
    lVar21 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    lVar21 = (ulong)((int)lVar21 * 9 + 0x49U >> 6) + 2;
  }
  uVar6 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_sfixed32_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 0xc0) & 4) == 0);
  if (uVar6 == 0) {
    local_90 = 0;
  }
  else {
    uVar17 = ((long)((ulong)uVar6 << 0x22) >> 0x20) + 1;
    lVar22 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    local_90 = (ulong)((int)lVar22 * 9 + 0x49U >> 6) + 2;
  }
  uVar7 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_sfixed64_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 0xd0) & 4) == 0);
  if (uVar7 == 0) {
    local_98 = 0;
  }
  else {
    uVar17 = ((long)((ulong)uVar7 << 0x23) >> 0x20) + 1;
    lVar22 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    local_98 = (ulong)((int)lVar22 * 9 + 0x49U >> 6) + 2;
  }
  uVar8 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_float_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 0xe0) & 4) == 0);
  if (uVar8 == 0) {
    lVar22 = 0;
  }
  else {
    uVar17 = ((long)((ulong)uVar8 << 0x22) >> 0x20) + 1;
    lVar22 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar22 == 0; lVar22 = lVar22 + -1) {
      }
    }
    lVar22 = (ulong)((int)lVar22 * 9 + 0x49U >> 6) + 2;
  }
  uVar9 = google::protobuf::internal::SooRep::size
                    (&(this->field_0)._impl_.repeated_double_.soo_rep_,
                     (*(byte *)((long)&this->field_0 + 0xf0) & 4) == 0);
  if (uVar9 == 0) {
    lVar23 = 0;
  }
  else {
    uVar17 = ((long)((ulong)uVar9 << 0x23) >> 0x20) + 1;
    lVar23 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar23 == 0; lVar23 = lVar23 + -1) {
      }
    }
    lVar23 = (ulong)((int)lVar23 * 9 + 0x49U >> 6) + 2;
  }
  uVar10 = google::protobuf::internal::SooRep::size
                     (&(this->field_0)._impl_.repeated_bool_.soo_rep_,
                      (*(byte *)((long)&this->field_0 + 0x100) & 4) == 0);
  if (uVar10 == 0) {
    lVar18 = 0;
  }
  else {
    lVar18 = 0x3f;
    if ((long)(int)(uVar10 | 1) != 0) {
      for (; (ulong)(long)(int)(uVar10 | 1) >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    lVar18 = (ulong)((int)lVar18 * 9 + 0x49U >> 6) + 2;
  }
  uVar1 = *(uint *)((long)&this->field_0 + 0x118);
  lVar21 = lVar23 + (ulong)uVar10 + lVar18 +
           ((ulong)uVar6 + (ulong)uVar4 + (ulong)uVar8) * 4 +
           lVar21 + local_90 + local_98 +
           sVar15 + sVar16 + local_88 + sVar13 + sVar14 + sVar12 + sVar11 + lVar22 +
           ((ulong)uVar7 + (ulong)uVar5 + (ulong)uVar9) * 8 + (ulong)uVar1 * 2;
  if (0 < (int)uVar1) {
    uVar4 = 0;
    do {
      pVVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_string_.super_RepeatedPtrFieldBase,uVar4
                          );
      uVar5 = (uint)pVVar19->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + pVVar19->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  uVar4 = *(uint *)((long)&this->field_0 + 0x130);
  lVar21 = lVar21 + (ulong)uVar4 * 2;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pVVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_bytes_.super_RepeatedPtrFieldBase,uVar5)
      ;
      uVar6 = (uint)pVVar19->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + pVVar19->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x148);
  this_00 = &(this->field_0)._impl_.repeatedgroup_;
  pRVar24 = this_00;
  if ((*(byte *)((long)&this->field_0 + 0x140) & 1) != 0) {
    pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&this_00->super_RepeatedPtrFieldBase);
    pRVar24 = (RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup> *)pRVar20->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup> *)pRVar20->elements;
    }
  }
  lVar21 = lVar21 + (long)iVar2 * 4;
  iVar2 = *(int *)((long)&this->field_0 + 0x148);
  for (; pRVar24 !=
         (RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup> *)
         (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar2);
      pRVar24 = (RepeatedPtrField<edition_unittest::TestAllTypes_RepeatedGroup> *)
                &(pRVar24->super_RepeatedPtrFieldBase).current_size_) {
    sVar11 = TestAllTypes_RepeatedGroup::ByteSizeLong
                       ((TestAllTypes_RepeatedGroup *)
                        (pRVar24->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    lVar21 = lVar21 + sVar11;
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x160);
  pRVar28 = &(this->field_0)._impl_.repeated_nested_message_;
  pRVar27 = pRVar28;
  if ((*(byte *)((long)&this->field_0 + 0x158) & 1) != 0) {
    pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&pRVar28->super_RepeatedPtrFieldBase);
    pRVar27 = (RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *)pRVar20->elements;
    if (((ulong)(pRVar28->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&pRVar28->super_RepeatedPtrFieldBase);
      pRVar28 = (RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *)pRVar20->elements;
    }
  }
  lVar21 = lVar21 + (long)iVar2 * 2;
  iVar2 = *(int *)((long)&this->field_0 + 0x160);
  for (; pRVar27 !=
         (RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *)
         (&(pRVar28->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar2);
      pRVar27 = (RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *)
                &(pRVar27->super_RepeatedPtrFieldBase).current_size_) {
    sVar11 = TestAllTypes_NestedMessage::ByteSizeLong
                       ((TestAllTypes_NestedMessage *)
                        (pRVar27->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar11 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar21 = lVar21 + sVar11 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x178);
  this_01 = &(this->field_0)._impl_.repeated_foreign_message_;
  pRVar25 = this_01;
  if ((*(byte *)((long)&this->field_0 + 0x170) & 1) != 0) {
    pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&this_01->super_RepeatedPtrFieldBase);
    pRVar25 = (RepeatedPtrField<edition_unittest::ForeignMessage> *)pRVar20->elements;
    if (((ulong)(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&this_01->super_RepeatedPtrFieldBase);
      this_01 = (RepeatedPtrField<edition_unittest::ForeignMessage> *)pRVar20->elements;
    }
  }
  lVar21 = lVar21 + (long)iVar2 * 2;
  iVar2 = *(int *)((long)&this->field_0 + 0x178);
  for (; pRVar25 !=
         (RepeatedPtrField<edition_unittest::ForeignMessage> *)
         (&(this_01->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar2);
      pRVar25 = (RepeatedPtrField<edition_unittest::ForeignMessage> *)
                &(pRVar25->super_RepeatedPtrFieldBase).current_size_) {
    sVar11 = ForeignMessage::ByteSizeLong
                       ((ForeignMessage *)(pRVar25->super_RepeatedPtrFieldBase).tagged_rep_or_elem_)
    ;
    uVar4 = (uint)sVar11 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar21 = lVar21 + sVar11 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  iVar2 = *(int *)((long)&this->field_0 + 400);
  this_02 = &(this->field_0)._impl_.repeated_import_message_;
  pRVar26 = this_02;
  if ((*(byte *)((long)&this->field_0 + 0x188) & 1) != 0) {
    pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&this_02->super_RepeatedPtrFieldBase);
    pRVar26 = (RepeatedPtrField<proto2_unittest_import::ImportMessage> *)pRVar20->elements;
    if (((ulong)(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&this_02->super_RepeatedPtrFieldBase);
      this_02 = (RepeatedPtrField<proto2_unittest_import::ImportMessage> *)pRVar20->elements;
    }
  }
  lVar21 = lVar21 + (long)iVar2 * 2;
  iVar2 = *(int *)((long)&this->field_0 + 400);
  for (; pRVar26 !=
         (RepeatedPtrField<proto2_unittest_import::ImportMessage> *)
         (&(this_02->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar2);
      pRVar26 = (RepeatedPtrField<proto2_unittest_import::ImportMessage> *)
                &(pRVar26->super_RepeatedPtrFieldBase).current_size_) {
    sVar11 = proto2_unittest_import::ImportMessage::ByteSizeLong
                       ((ImportMessage *)(pRVar26->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar11 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar21 = lVar21 + sVar11 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  sVar11 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_nested_enum_,2,
                      &(this->field_0)._impl_._repeated_nested_enum_cached_byte_size_);
  sVar12 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_foreign_enum_,2,
                      &(this->field_0)._impl_._repeated_foreign_enum_cached_byte_size_);
  sVar13 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_import_enum_,2,
                      &(this->field_0)._impl_._repeated_import_enum_cached_byte_size_);
  uVar4 = *(uint *)((long)&this->field_0 + 0x1f0);
  lVar21 = sVar13 + sVar12 + sVar11 + lVar21 + (ulong)uVar4 * 2;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pVVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_string_piece_.super_RepeatedPtrFieldBase
                           ,uVar5);
      uVar6 = (uint)pVVar19->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + pVVar19->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  uVar4 = *(uint *)((long)&this->field_0 + 0x208);
  lVar21 = lVar21 + (ulong)uVar4 * 2;
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pVVar19 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&(this->field_0)._impl_.repeated_cord_.super_RepeatedPtrFieldBase,uVar5);
      uVar6 = (uint)pVVar19->_M_string_length | 1;
      iVar2 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + pVVar19->_M_string_length + (ulong)(iVar2 * 9 + 0x49U >> 6);
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x220);
  pRVar28 = &(this->field_0)._impl_.repeated_lazy_message_;
  pRVar27 = pRVar28;
  if ((*(byte *)((long)&this->field_0 + 0x218) & 1) != 0) {
    pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                        (&pRVar28->super_RepeatedPtrFieldBase);
    pRVar27 = (RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *)pRVar20->elements;
    if (((ulong)(pRVar28->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar20 = google::protobuf::internal::RepeatedPtrFieldBase::rep
                          (&pRVar28->super_RepeatedPtrFieldBase);
      pRVar28 = (RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *)pRVar20->elements;
    }
  }
  lVar21 = lVar21 + (long)iVar2 * 2;
  iVar2 = *(int *)((long)&this->field_0 + 0x220);
  for (; pRVar27 !=
         (RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *)
         (&(pRVar28->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar2);
      pRVar27 = (RepeatedPtrField<edition_unittest::TestAllTypes_NestedMessage> *)
                &(pRVar27->super_RepeatedPtrFieldBase).current_size_) {
    sVar11 = TestAllTypes_NestedMessage::ByteSizeLong
                       ((TestAllTypes_NestedMessage *)
                        (pRVar27->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar4 = (uint)sVar11 | 1;
    iVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    lVar21 = lVar21 + sVar11 + (ulong)(iVar3 * 9 + 0x49U >> 6);
  }
  uVar4 = (this->field_0)._impl_._has_bits_.has_bits_[0];
  lVar21 = (ulong)(uVar4 >> 0x16 & 2) + lVar21 +
           (ulong)((((uVar4 >> 0x12 & 0x13) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c) * 9
                  ) +
           (ulong)((((uVar4 >> 0x11 & 0x19) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1c) * 5
                  );
  if ((char)uVar4 != '\0') {
    if ((uVar4 & 1) != 0) {
      lVar22 = *(long *)(((ulong)(this->field_0)._impl_.optional_string_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar22 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + lVar22 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 2) != 0) {
      lVar22 = *(long *)(((ulong)(this->field_0)._impl_.optional_bytes_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar22 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + lVar22 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar4 & 4) != 0) {
      lVar22 = *(long *)(((ulong)(this->field_0)._impl_.optional_string_piece_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar22 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + lVar22 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 8) != 0) {
      lVar22 = *(long *)(((ulong)(this->field_0)._impl_.optional_cord_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar22 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + lVar22 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 0x10) != 0) {
      sVar11 = TestAllTypes_OptionalGroup::ByteSizeLong((this->field_0)._impl_.optionalgroup_);
      lVar21 = lVar21 + sVar11 + 4;
    }
    if ((uVar4 & 0x20) != 0) {
      sVar11 = TestAllTypes_NestedMessage::ByteSizeLong
                         ((this->field_0)._impl_.optional_nested_message_);
      uVar5 = (uint)sVar11 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + sVar11 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 0x40) != 0) {
      sVar11 = ForeignMessage::ByteSizeLong((this->field_0)._impl_.optional_foreign_message_);
      uVar5 = (uint)sVar11 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + sVar11 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((char)uVar4 < '\0') {
      sVar11 = proto2_unittest_import::ImportMessage::ByteSizeLong
                         ((this->field_0)._impl_.optional_import_message_);
      uVar5 = (uint)sVar11 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + sVar11 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
  }
  if ((uVar4 & 0xff00) != 0) {
    if ((uVar4 >> 8 & 1) != 0) {
      sVar11 = proto2_unittest_import::PublicImportMessage::ByteSizeLong
                         ((this->field_0)._impl_.optional_public_import_message_);
      uVar5 = (uint)sVar11 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + sVar11 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 9 & 1) != 0) {
      sVar11 = TestAllTypes_NestedMessage::ByteSizeLong
                         ((this->field_0)._impl_.optional_lazy_message_);
      uVar5 = (uint)sVar11 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + sVar11 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 10 & 1) != 0) {
      sVar11 = TestAllTypes_NestedMessage::ByteSizeLong
                         ((this->field_0)._impl_.optional_unverified_lazy_message_);
      uVar5 = (uint)sVar11 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + sVar11 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 0xb & 1) != 0) {
      uVar17 = (this->field_0)._impl_.optional_int64_ | 1;
      lVar22 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar22 == 0; lVar22 = lVar22 + -1) {
        }
      }
      lVar21 = lVar21 + (ulong)((int)lVar22 * 9 + 0x89U >> 6);
    }
    if ((uVar4 >> 0xc & 1) != 0) {
      uVar17 = (long)(this->field_0)._impl_.optional_int32_ | 1;
      lVar22 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar22 == 0; lVar22 = lVar22 + -1) {
        }
      }
      lVar21 = lVar21 + (ulong)((int)lVar22 * 9 + 0x89U >> 6);
    }
    if ((uVar4 >> 0xd & 1) != 0) {
      uVar5 = (this->field_0)._impl_.optional_uint32_ | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + (ulong)(iVar2 * 9 + 0x89U >> 6);
    }
    if ((uVar4 >> 0xe & 1) != 0) {
      uVar17 = (this->field_0)._impl_.optional_uint64_ | 1;
      lVar22 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar22 == 0; lVar22 = lVar22 + -1) {
        }
      }
      lVar21 = lVar21 + (ulong)((int)lVar22 * 9 + 0x89U >> 6);
    }
    if ((short)uVar4 < 0) {
      lVar22 = (this->field_0)._impl_.optional_sint64_;
      uVar17 = lVar22 >> 0x3f ^ lVar22 * 2 | 1;
      lVar22 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar22 == 0; lVar22 = lVar22 + -1) {
        }
      }
      lVar21 = lVar21 + (ulong)((int)lVar22 * 9 + 0x89U >> 6);
    }
  }
  if ((uVar4 >> 0x10 & 1) != 0) {
    iVar2 = (this->field_0)._impl_.optional_sint32_;
    uVar5 = iVar2 >> 0x1f ^ iVar2 * 2 | 1;
    iVar2 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar21 = lVar21 + (ulong)(iVar2 * 9 + 0x89U >> 6);
  }
  if (0xffffff < uVar4) {
    if ((uVar4 >> 0x18 & 1) != 0) {
      uVar17 = (long)(this->field_0)._impl_.optional_import_enum_ | 1;
      lVar22 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar22 == 0; lVar22 = lVar22 + -1) {
        }
      }
      lVar21 = lVar21 + (ulong)((int)lVar22 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 0x19 & 1) != 0) {
      uVar17 = (long)(this->field_0)._impl_.optional_nested_enum_ | 1;
      lVar22 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar22 == 0; lVar22 = lVar22 + -1) {
        }
      }
      lVar21 = lVar21 + (ulong)((int)lVar22 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 0x1a & 1) != 0) {
      uVar17 = (long)(this->field_0)._impl_.optional_foreign_enum_ | 1;
      lVar22 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar22 == 0; lVar22 = lVar22 + -1) {
        }
      }
      lVar21 = lVar21 + (ulong)((int)lVar22 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 0x1b & 1) != 0) {
      lVar22 = *(long *)(((ulong)(this->field_0)._impl_.default_string_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar22 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + lVar22 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 0x1c & 1) != 0) {
      lVar22 = *(long *)(((ulong)(this->field_0)._impl_.default_bytes_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar22 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + lVar22 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 0x1d & 1) != 0) {
      lVar22 = *(long *)(((ulong)(this->field_0)._impl_.default_string_piece_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar22 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + lVar22 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 0x1e & 1) != 0) {
      lVar22 = *(long *)(((ulong)(this->field_0)._impl_.default_cord_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc) + 8);
      uVar5 = (uint)lVar22 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + lVar22 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((int)uVar4 < 0) {
      uVar17 = (ulong)*(char *)((long)&this->field_0 + 0x300);
      if ((uVar17 & 1) == 0) {
        uVar17 = uVar17 >> 1;
      }
      else {
        uVar17 = **(ulong **)((long)&this->field_0 + 0x308);
      }
      uVar4 = (uint)uVar17 | 1;
      iVar2 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      lVar21 = lVar21 + uVar17 + (ulong)(iVar2 * 9 + 0x49U >> 6) + 2;
    }
  }
  uVar4 = (this->field_0)._impl_._has_bits_.has_bits_[1];
  sVar11 = (ulong)(uVar4 >> 0xc & 1) * 3 +
           (ulong)((((uVar4 >> 7 & 0x13) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1b &
                   0xfffffffe) * 5) + lVar21 +
           (ulong)((((uVar4 >> 6 & 0x19) * 0x8040201 >> 3 & 0x11111111) * 0x11111111 >> 0x1b &
                   0xfffffffe) * 3);
  if ((uVar4 & 0x3f) != 0) {
    if ((uVar4 & 1) != 0) {
      uVar17 = (this->field_0)._impl_.default_int64_ | 1;
      lVar21 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      sVar11 = sVar11 + ((int)lVar21 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 2) != 0) {
      uVar17 = (long)(this->field_0)._impl_.default_int32_ | 1;
      lVar21 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      sVar11 = sVar11 + ((int)lVar21 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 4) != 0) {
      uVar5 = (this->field_0)._impl_.default_uint32_ | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + (iVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 8) != 0) {
      uVar17 = (this->field_0)._impl_.default_uint64_ | 1;
      lVar21 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      sVar11 = sVar11 + ((int)lVar21 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 0x10) != 0) {
      lVar21 = (this->field_0)._impl_.default_sint64_;
      uVar17 = lVar21 >> 0x3f ^ lVar21 * 2 | 1;
      lVar21 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      sVar11 = sVar11 + ((int)lVar21 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 & 0x20) != 0) {
      iVar2 = (this->field_0)._impl_.default_sint32_;
      uVar5 = iVar2 >> 0x1f ^ iVar2 * 2 | 1;
      iVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      sVar11 = sVar11 + (iVar2 * 9 + 0x49U >> 6) + 2;
    }
  }
  if ((uVar4 & 0xe000) != 0) {
    if ((uVar4 >> 0xd & 1) != 0) {
      uVar17 = (long)(this->field_0)._impl_.default_nested_enum_ | 1;
      lVar21 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      sVar11 = sVar11 + ((int)lVar21 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar4 >> 0xe & 1) != 0) {
      uVar17 = (long)(this->field_0)._impl_.default_foreign_enum_ | 1;
      lVar21 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      sVar11 = sVar11 + ((int)lVar21 * 9 + 0x49U >> 6) + 2;
    }
    if ((short)uVar4 < 0) {
      uVar17 = (long)(this->field_0)._impl_.default_import_enum_ | 1;
      lVar21 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar21 == 0; lVar21 = lVar21 + -1) {
        }
      }
      sVar11 = sVar11 + ((int)lVar21 * 9 + 0x49U >> 6) + 2;
    }
  }
  switch((this->field_0)._impl_._oneof_case_[0]) {
  case 0x6f:
    sVar12 = (size_t)*(uint *)((long)&this->field_0 + 0x368);
    goto LAB_00c2212a;
  case 0x70:
  case 0x75:
    sVar12 = TestAllTypes_NestedMessage::ByteSizeLong
                       ((this->field_0)._impl_.oneof_field_.oneof_nested_message_);
    break;
  case 0x71:
  case 0x72:
  case 0x73:
  case 0x74:
    sVar12 = *(size_t *)
              (((ulong)(this->field_0)._impl_.oneof_field_.oneof_nested_message_ &
               0xfffffffffffffffc) + 8);
    break;
  default:
    goto switchD_00c22108_default;
  }
  sVar11 = sVar11 + sVar12;
LAB_00c2212a:
  uVar4 = (uint)sVar12 | 1;
  iVar2 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  sVar11 = sVar11 + (iVar2 * 9 + 0x49U >> 6) + 2;
switchD_00c22108_default:
  sVar11 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                     (&this->super_Message,sVar11,&(this->field_0)._impl_._cached_size_);
  return sVar11;
}

Assistant:

::size_t TestAllTypes::ByteSizeLong() const {
  const TestAllTypes& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.TestAllTypes)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 repeated_int32 = 31;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_repeated_int32(), 2,
              this_._impl_._repeated_int32_cached_byte_size_);
    }
    // repeated int64 repeated_int64 = 32;
    {
      total_size +=
          ::_pbi::WireFormatLite::Int64SizeWithPackedTagSize(
              this_._internal_repeated_int64(), 2,
              this_._impl_._repeated_int64_cached_byte_size_);
    }
    // repeated uint32 repeated_uint32 = 33;
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt32SizeWithPackedTagSize(
              this_._internal_repeated_uint32(), 2,
              this_._impl_._repeated_uint32_cached_byte_size_);
    }
    // repeated uint64 repeated_uint64 = 34;
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt64SizeWithPackedTagSize(
              this_._internal_repeated_uint64(), 2,
              this_._impl_._repeated_uint64_cached_byte_size_);
    }
    // repeated sint32 repeated_sint32 = 35;
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt32SizeWithPackedTagSize(
              this_._internal_repeated_sint32(), 2,
              this_._impl_._repeated_sint32_cached_byte_size_);
    }
    // repeated sint64 repeated_sint64 = 36;
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt64SizeWithPackedTagSize(
              this_._internal_repeated_sint64(), 2,
              this_._impl_._repeated_sint64_cached_byte_size_);
    }
    // repeated fixed32 repeated_fixed32 = 37;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated fixed64 repeated_fixed64 = 38;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed32 repeated_sfixed32 = 39;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed64 repeated_sfixed64 = 40;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_sfixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated float repeated_float = 41;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_float_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated double repeated_double = 42;
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_repeated_double_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool repeated_bool = 43;
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_bool_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated string repeated_string = 44;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string().size());
      for (int i = 0, n = this_._internal_repeated_string().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string().Get(i));
      }
    }
    // repeated bytes repeated_bytes = 45;
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_bytes().size());
      for (int i = 0, n = this_._internal_repeated_bytes().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::BytesSize(
            this_._internal_repeated_bytes().Get(i));
      }
    }
    // repeated .edition_unittest.TestAllTypes.RepeatedGroup repeatedgroup = 46 [features = {
    {
      total_size += 4UL * this_._internal_repeatedgroup_size();
      for (const auto& msg : this_._internal_repeatedgroup()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
    // repeated .edition_unittest.TestAllTypes.NestedMessage repeated_nested_message = 48;
    {
      total_size += 2UL * this_._internal_repeated_nested_message_size();
      for (const auto& msg : this_._internal_repeated_nested_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .edition_unittest.ForeignMessage repeated_foreign_message = 49;
    {
      total_size += 2UL * this_._internal_repeated_foreign_message_size();
      for (const auto& msg : this_._internal_repeated_foreign_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest_import.ImportMessage repeated_import_message = 50;
    {
      total_size += 2UL * this_._internal_repeated_import_message_size();
      for (const auto& msg : this_._internal_repeated_import_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .edition_unittest.TestAllTypes.NestedEnum repeated_nested_enum = 51;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_nested_enum(), 2, this_._impl_._repeated_nested_enum_cached_byte_size_);
    }
    // repeated .edition_unittest.ForeignEnum repeated_foreign_enum = 52;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_foreign_enum(), 2, this_._impl_._repeated_foreign_enum_cached_byte_size_);
    }
    // repeated .proto2_unittest_import.ImportEnum repeated_import_enum = 53;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_import_enum(), 2, this_._impl_._repeated_import_enum_cached_byte_size_);
    }
    // repeated string repeated_string_piece = 54 [ctype = STRING_PIECE];
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_string_piece().size());
      for (int i = 0, n = this_._internal_repeated_string_piece().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_string_piece().Get(i));
      }
    }
    // repeated string repeated_cord = 55 [ctype = CORD];
    {
      total_size +=
          2 * ::google::protobuf::internal::FromIntSize(this_._internal_repeated_cord().size());
      for (int i = 0, n = this_._internal_repeated_cord().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_repeated_cord().Get(i));
      }
    }
    // repeated .edition_unittest.TestAllTypes.NestedMessage repeated_lazy_message = 57;
    {
      total_size += 2UL * this_._internal_repeated_lazy_message_size();
      for (const auto& msg : this_._internal_repeated_lazy_message()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x004c0000u & cached_has_bits) * 9;
  total_size += ::absl::popcount(0x00320000u & cached_has_bits) * 5;
  total_size += static_cast<bool>(0x00800000u & cached_has_bits) * 2;
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // string optional_string = 14;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string());
    }
    // bytes optional_bytes = 15;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_optional_bytes());
    }
    // string optional_string_piece = 24 [ctype = STRING_PIECE];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_string_piece());
    }
    // string optional_cord = 25 [ctype = CORD];
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_optional_cord());
    }
    // .edition_unittest.TestAllTypes.OptionalGroup optionalgroup = 16 [features = {
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 4 +
                    ::google::protobuf::internal::WireFormatLite::GroupSize(*this_._impl_.optionalgroup_);
    }
    // .edition_unittest.TestAllTypes.NestedMessage optional_nested_message = 18;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_nested_message_);
    }
    // .edition_unittest.ForeignMessage optional_foreign_message = 19;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_foreign_message_);
    }
    // .proto2_unittest_import.ImportMessage optional_import_message = 20;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_import_message_);
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    // .proto2_unittest_import.PublicImportMessage optional_public_import_message = 26;
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_public_import_message_);
    }
    // .edition_unittest.TestAllTypes.NestedMessage optional_lazy_message = 27 [lazy = true];
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_lazy_message_);
    }
    // .edition_unittest.TestAllTypes.NestedMessage optional_unverified_lazy_message = 28 [unverified_lazy = true];
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.optional_unverified_lazy_message_);
    }
    // int64 optional_int64 = 2;
    if ((cached_has_bits & 0x00000800u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_optional_int64());
    }
    // int32 optional_int32 = 1;
    if ((cached_has_bits & 0x00001000u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int32SizePlusOne(
          this_._internal_optional_int32());
    }
    // uint32 optional_uint32 = 3;
    if ((cached_has_bits & 0x00002000u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt32SizePlusOne(
          this_._internal_optional_uint32());
    }
    // uint64 optional_uint64 = 4;
    if ((cached_has_bits & 0x00004000u) != 0) {
      total_size += ::_pbi::WireFormatLite::UInt64SizePlusOne(
          this_._internal_optional_uint64());
    }
    // sint64 optional_sint64 = 6;
    if ((cached_has_bits & 0x00008000u) != 0) {
      total_size += ::_pbi::WireFormatLite::SInt64SizePlusOne(
          this_._internal_optional_sint64());
    }
  }
   {
    // sint32 optional_sint32 = 5;
    if ((cached_has_bits & 0x00010000u) != 0) {
      total_size += ::_pbi::WireFormatLite::SInt32SizePlusOne(
          this_._internal_optional_sint32());
    }
  }
  if ((cached_has_bits & 0xff000000u) != 0) {
    // .proto2_unittest_import.ImportEnum optional_import_enum = 23;
    if ((cached_has_bits & 0x01000000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_import_enum());
    }
    // .edition_unittest.TestAllTypes.NestedEnum optional_nested_enum = 21;
    if ((cached_has_bits & 0x02000000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_nested_enum());
    }
    // .edition_unittest.ForeignEnum optional_foreign_enum = 22;
    if ((cached_has_bits & 0x04000000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_foreign_enum());
    }
    // string default_string = 74 [default = "hello"];
    if ((cached_has_bits & 0x08000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_string());
    }
    // bytes default_bytes = 75 [default = "world"];
    if ((cached_has_bits & 0x10000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_default_bytes());
    }
    // string default_string_piece = 84 [default = "abc", ctype = STRING_PIECE];
    if ((cached_has_bits & 0x20000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_string_piece());
    }
    // string default_cord = 85 [default = "123", ctype = CORD];
    if ((cached_has_bits & 0x40000000u) != 0) {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_default_cord());
    }
    // bytes optional_bytes_cord = 86 [ctype = CORD];
    if ((cached_has_bits & 0x80000000u) != 0) {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::BytesSize(
          this_._internal_optional_bytes_cord());
    }
  }
  cached_has_bits = this_._impl_._has_bits_[1];
  total_size += ::absl::popcount(0x00000980u & cached_has_bits) * 10;
  total_size += ::absl::popcount(0x00000640u & cached_has_bits) * 6;
  total_size += static_cast<bool>(0x00001000u & cached_has_bits) * 3;
  if ((cached_has_bits & 0x0000003fu) != 0) {
    // int64 default_int64 = 62 [default = 42];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int64Size(
                                      this_._internal_default_int64());
    }
    // int32 default_int32 = 61 [default = 41];
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_default_int32());
    }
    // uint32 default_uint32 = 63 [default = 43];
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_default_uint32());
    }
    // uint64 default_uint64 = 64 [default = 44];
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::UInt64Size(
                                      this_._internal_default_uint64());
    }
    // sint64 default_sint64 = 66 [default = 46];
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::SInt64Size(
                                      this_._internal_default_sint64());
    }
    // sint32 default_sint32 = 65 [default = -45];
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::SInt32Size(
                                      this_._internal_default_sint32());
    }
  }
  if ((cached_has_bits & 0x0000e000u) != 0) {
    // .edition_unittest.TestAllTypes.NestedEnum default_nested_enum = 81 [default = BAR];
    if ((cached_has_bits & 0x00002000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_nested_enum());
    }
    // .edition_unittest.ForeignEnum default_foreign_enum = 82 [default = FOREIGN_BAR];
    if ((cached_has_bits & 0x00004000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_foreign_enum());
    }
    // .proto2_unittest_import.ImportEnum default_import_enum = 83 [default = IMPORT_BAR];
    if ((cached_has_bits & 0x00008000u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_default_import_enum());
    }
  }
  switch (this_.oneof_field_case()) {
    // uint32 oneof_uint32 = 111;
    case kOneofUint32: {
      total_size += 2 + ::_pbi::WireFormatLite::UInt32Size(
                                      this_._internal_oneof_uint32());
      break;
    }
    // .edition_unittest.TestAllTypes.NestedMessage oneof_nested_message = 112;
    case kOneofNestedMessage: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_nested_message_);
      break;
    }
    // string oneof_string = 113;
    case kOneofString: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_oneof_string());
      break;
    }
    // bytes oneof_bytes = 114;
    case kOneofBytes: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::BytesSize(
                                      this_._internal_oneof_bytes());
      break;
    }
    // string oneof_cord = 115 [ctype = CORD];
    case kOneofCord: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_oneof_cord());
      break;
    }
    // string oneof_string_piece = 116 [ctype = STRING_PIECE];
    case kOneofStringPiece: {
      total_size += 2 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_oneof_string_piece());
      break;
    }
    // .edition_unittest.TestAllTypes.NestedMessage oneof_lazy_nested_message = 117 [lazy = true];
    case kOneofLazyNestedMessage: {
      total_size += 2 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.oneof_field_.oneof_lazy_nested_message_);
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}